

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::
       getTessellationOutputDescription
                 (TessellationOutputType tessellationOutput,TessellationPointMode pointMode)

{
  TessellationPointMode pointMode_local;
  TessellationOutputType tessellationOutput_local;
  
  if (tessellationOutput == TESSELLATION_OUT_TRIANGLES) {
    _pointMode_local = "triangles";
    if (pointMode != TESSELLATION_POINTMODE_OFF) {
      _pointMode_local = "points (triangles in point mode)";
    }
  }
  else if (tessellationOutput == TESSELLATION_OUT_QUADS) {
    _pointMode_local = "quads";
    if (pointMode != TESSELLATION_POINTMODE_OFF) {
      _pointMode_local = "points (quads in point mode)";
    }
  }
  else if (tessellationOutput == TESSELLATION_OUT_ISOLINES) {
    _pointMode_local = "isolines";
    if (pointMode != TESSELLATION_POINTMODE_OFF) {
      _pointMode_local = "points (isolines in point mode)";
    }
  }
  else {
    _pointMode_local = (char *)0x0;
  }
  return _pointMode_local;
}

Assistant:

const char* FeedbackPrimitiveTypeCase::getTessellationOutputDescription (TessellationOutputType tessellationOutput, TessellationPointMode pointMode)
{
	switch (tessellationOutput)
	{
		case TESSELLATION_OUT_TRIANGLES:	return (pointMode) ? ("points (triangles in point mode)") : ("triangles");
		case TESSELLATION_OUT_QUADS:		return (pointMode) ? ("points (quads in point mode)")     : ("quads");
		case TESSELLATION_OUT_ISOLINES:		return (pointMode) ? ("points (isolines in point mode)")  : ("isolines");
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}